

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopStyleVar(int count)

{
  ImGuiContext *pIVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  pIVar1 = GImGui;
  if (0 < count) {
    iVar3 = (GImGui->StyleVarStack).Size;
    piVar2 = (GImGui->StyleVarStack).Data[(long)iVar3 + -1].field_1.BackupInt + 1;
    iVar4 = count + 1;
    do {
      iVar3 = iVar3 + -1;
      uVar5 = (ulong)GStyleVarInfo[piVar2[-2]].Offset;
      if (GStyleVarInfo[piVar2[-2]].Count == 2) {
        *(int *)((long)&(pIVar1->Style).Alpha + uVar5) = piVar2[-1];
        *(int *)((long)&(pIVar1->Style).DisabledAlpha + uVar5) = *piVar2;
      }
      else if (GStyleVarInfo[piVar2[-2]].Count == 1) {
        *(int *)((long)&(pIVar1->Style).Alpha + uVar5) = piVar2[-1];
      }
      (pIVar1->StyleVarStack).Size = iVar3;
      piVar2 = piVar2 + -3;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}